

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::FirstGroup::init(FirstGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int extraout_EAX;
  DrawTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc_00;
  DrawTest *test;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string desc;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string name;
  int firstNdx;
  undefined1 local_70 [8];
  DrawTestSpec spec;
  int firsts [3];
  FirstGroup *this_local;
  
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000001;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_70);
  genBasicSpec((DrawTestSpec *)local_70,this->m_method);
  for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 3;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"first_",&local_c1);
    de::toString<int>((string *)((long)&desc.field_2 + 8),
                      firsts + (long)(int)name.field_2._8_4_ + -2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"first ",&local_129);
    de::toString<int>((string *)&test,firsts + (long)(int)name.field_2._8_4_ + -2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&test);
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    this_00 = (DrawTest *)operator_new(0x138);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
    name_00 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::DrawTest(this_00,testCtx,renderCtx,name_00,desc_00);
    spec.indexPointerOffset = firsts[(long)(int)name.field_2._8_4_ + -2];
    addTestIterations(this_00,(DrawTestSpec *)local_70,TYPE_DRAW_COUNT);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_a0);
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_70);
  return extraout_EAX;
}

Assistant:

void FirstGroup::init (void)
{
	const int firsts[] =
	{
		1, 3, 17
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); ++firstNdx)
	{
		const std::string	name = std::string("first_") + de::toString(firsts[firstNdx]);
		const std::string	desc = std::string("first ") + de::toString(firsts[firstNdx]);
		gls::DrawTest*		test = new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.first = firsts[firstNdx];

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}
}